

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O2

void __thiscall
Deck::discard(Deck *this,Hand *hand,vector<CardType,_std::allocator<CardType>_> *discardedCards)

{
  value_type vVar1;
  pointer pCVar2;
  pointer pCVar3;
  vector<CardType,_std::allocator<CardType>_> *pvVar4;
  reference pvVar5;
  length_error *this_00;
  int i;
  uint uVar6;
  size_type sVar7;
  ulong __n;
  int i_1;
  
  pCVar2 = (hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar3 = (hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar7 = 0; sVar7 != 3; sVar7 = sVar7 + 1) {
    pvVar4 = this->discardPointer;
    pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(discardedCards,sVar7);
    std::vector<CardType,_std::allocator<CardType>_>::push_back(pvVar4,pvVar5);
  }
  sVar7 = 0;
  do {
    if (sVar7 == 3) {
      if ((long)(hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl
                .super__Vector_impl_data._M_start >> 2 !=
          ((ulong)((long)pCVar2 - (long)pCVar3) >> 2 & 0xffffffff)) {
        return;
      }
      this_00 = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error
                (this_00,
                 "The three cards were not removed from the hand once exchanged successfully. System exiting."
                );
      __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
    }
    uVar6 = 0;
    while( true ) {
      __n = (ulong)uVar6;
      pvVar4 = hand->handPointer;
      if ((ulong)((long)(pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= __n) break;
      pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(pvVar4,__n);
      vVar1 = *pvVar5;
      pvVar5 = std::vector<CardType,_std::allocator<CardType>_>::at(discardedCards,sVar7);
      if (vVar1 == *pvVar5) {
        std::vector<CardType,_std::allocator<CardType>_>::erase
                  (hand->handPointer,
                   (const_iterator)
                   ((hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>).
                    _M_impl.super__Vector_impl_data._M_start + __n));
        break;
      }
      uVar6 = uVar6 + 1;
    }
    sVar7 = sVar7 + 1;
  } while( true );
}

Assistant:

void Deck::discard(Hand* hand, std::vector<CardType> discardedCards) {

    unsigned int initialHandSize = hand->getHand()->size();

    for (int i = 0; i < 3; i++) {
        Deck::discardPointer->push_back(discardedCards.at(i));
    }

    for (int i = 0; i < 3; i++) {
        unsigned int counter = 0; // position in vector
        int removedCard = 0;

        while (removedCard == 0 && counter <
                                   hand->getHand()->size()) { //stop once the vector has been gone through completely or a card was removed
            if (hand->getHand()->at(counter) == discardedCards.at(i)) {
                hand->getHand()->erase(hand->getHand()->begin() + counter);
                removedCard = 1;
            } else {
                counter++;
            }
        }
    }

    // checks if the cards were removed from the hand as expected
    if (hand->getHand()->size() == initialHandSize) {
        throw std::length_error(
                "The three cards were not removed from the hand once exchanged successfully. System exiting.");
    }
}